

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.h
# Opt level: O2

void __thiscall
cmSetSourceFilesPropertiesCommand::~cmSetSourceFilesPropertiesCommand
          (cmSetSourceFilesPropertiesCommand *this)

{
  cmCommand::~cmCommand(&this->super_cmCommand);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmSetSourceFilesPropertiesCommand; }